

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_timeout.cc
# Opt level: O1

int64_t __thiscall
absl::lts_20240722::synchronization_internal::KernelTimeout::MakeAbsNanos(KernelTimeout *this)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  
  uVar1 = this->rep_;
  lVar4 = 0x7fffffffffffffff;
  if (uVar1 != 0xffffffffffffffff) {
    uVar5 = uVar1 >> 1;
    if ((uVar1 & 1) == 0) {
      lVar4 = uVar5 + (uVar5 == 0);
    }
    else {
      lVar2 = std::chrono::_V2::steady_clock::now();
      lVar2 = uVar5 - lVar2;
      lVar6 = 0;
      if (0 < lVar2) {
        lVar6 = lVar2;
      }
      lVar3 = absl::lts_20240722::GetCurrentTimeNanos();
      if (lVar2 <= 0x7fffffffffffffff - lVar3) {
        lVar4 = lVar6 + lVar3;
      }
    }
  }
  return lVar4;
}

Assistant:

int64_t KernelTimeout::MakeAbsNanos() const {
  if (!has_timeout()) {
    return kMaxNanos;
  }

  int64_t nanos = RawAbsNanos();

  if (is_relative_timeout()) {
    // We need to change epochs, because the relative timeout might be
    // represented by an absolute timestamp from another clock.
    nanos = std::max<int64_t>(nanos - SteadyClockNow(), 0);
    int64_t now = absl::GetCurrentTimeNanos();
    if (nanos > kMaxNanos - now) {
      // Overflow.
      nanos = kMaxNanos;
    } else {
      nanos += now;
    }
  } else if (nanos == 0) {
    // Some callers have assumed that 0 means no timeout, so instead we return a
    // time of 1 nanosecond after the epoch.
    nanos = 1;
  }

  return nanos;
}